

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O2

int SUNLinSolSetup_Band(SUNLinearSolver S,SUNMatrix A)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  
  pvVar1 = A->content;
  lVar3 = SUNDlsMat_bandGBTRF(*(undefined8 *)((long)pvVar1 + 0x40),*(undefined8 *)((long)pvVar1 + 8)
                              ,*(undefined8 *)((long)pvVar1 + 0x18),
                              *(undefined8 *)((long)pvVar1 + 0x20),
                              *(undefined8 *)((long)pvVar1 + 0x28),
                              *(undefined8 *)((long)S->content + 8));
  *(long *)((long)S->content + 0x10) = lVar3;
  iVar2 = 0x328;
  if (lVar3 < 1) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int SUNLinSolSetup_Band(SUNLinearSolver S, SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype** A_cols;
  sunindextype* pivots;

  SUNAssert(A, SUN_ERR_ARG_CORRUPT);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SM_COLS_B(A);
  pivots = PIVOTS(S);
  SUNAssert(A_cols, SUN_ERR_ARG_CORRUPT);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);

  /* ensure that storage upper bandwidth is sufficient for fill-in */
  SUNAssert(SM_SUBAND_B(A) >=
              SUNMIN(SM_COLUMNS_B(A) - 1, SM_UBAND_B(A) + SM_LBAND_B(A)),
            SUN_ERR_ARG_INCOMPATIBLE);

  /* perform LU factorization of input matrix */
  LASTFLAG(S) = SUNDlsMat_bandGBTRF(A_cols, SM_COLUMNS_B(A), SM_UBAND_B(A),
                                    SM_LBAND_B(A), SM_SUBAND_B(A), pivots);

  /* store error flag (if nonzero, that row encountered zero-valued pivot) */
  if (LASTFLAG(S) > 0) { return (SUNLS_LUFACT_FAIL); }
  return SUN_SUCCESS;
}